

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_send(nn_sock *self,nn_msg *msg,int flags)

{
  nn_ctx *self_00;
  int iVar1;
  int extraout_EAX;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if ((self->socktype->flags & 2) == 0) {
    self_00 = &self->ctx;
    nn_ctx_enter(self_00);
    if (self->sndtimeo < 0) {
      lVar5 = 0xffffffff;
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar2 = nn_clock_ms();
      lVar5 = (long)self->sndtimeo;
      uVar4 = uVar2 + lVar5;
    }
    iVar3 = -9;
    if (2 < self->state - 3U) {
      do {
        iVar1 = (*self->sockbase->vfptr->send)(self->sockbase,msg);
        if (iVar1 == 0) {
          iVar3 = 0;
          break;
        }
        if (-1 < iVar1) {
          nn_sock_send_cold_2();
          iVar1 = extraout_EAX;
LAB_0012179f:
          if (iVar1 == -0x6e) {
            return -0x6e;
          }
          if (iVar1 == -4) {
            return -4;
          }
          if (iVar1 == -9) {
            return -9;
          }
          nn_sock_send_cold_1();
        }
        nn_ctx_leave(self_00);
        if (iVar1 != -0xb || (flags & 1U) != 0) {
          return iVar1;
        }
        iVar1 = nn_efd_wait(&self->sndfd,(int)lVar5);
        if (iVar1 != 0) goto LAB_0012179f;
        nn_ctx_enter(self_00);
        iVar1 = nn_efd_wait(&self->sndfd,0);
        if (iVar1 == 0) {
          *(byte *)&self->flags = (byte)self->flags | 2;
        }
        if (-1 < self->sndtimeo) {
          uVar2 = nn_clock_ms();
          lVar5 = 0;
          if (uVar2 <= uVar4) {
            lVar5 = uVar4 - uVar2;
          }
        }
      } while (2 < self->state - 3U);
    }
    nn_ctx_leave(self_00);
  }
  else {
    iVar3 = -0x5f;
  }
  return iVar3;
}

Assistant:

int nn_sock_send (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for sending messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for SNDTIMEO timer. */
    if (self->sndtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->sndtimeo;
        timeout = self->sndtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to send the message in a non-blocking way. */
        rc = self->sockbase->vfptr->send (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be sent at the moment and the send call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking send, wait while there are new pipes available
            for sending. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->sndfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for sending
         */
        if (!nn_efd_wait (&self->sndfd, 0)) {
            self->flags |= NN_SOCK_FLAG_OUT;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->sndtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}